

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::chPrimalFeas(KktCheck *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  ostream *poVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  bVar7 = true;
  for (iVar5 = 0; this->i = iVar5, iVar5 < this->numRow; iVar5 = iVar5 + 1) {
    lVar8 = (long)iVar5;
    piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar11 = 0.0;
    for (lVar9 = (long)piVar1[lVar8]; this->k = (int)lVar9, lVar9 < piVar1[lVar8 + 1];
        lVar9 = lVar9 + 1) {
      dVar11 = dVar11 + pdVar3[piVar2[lVar9]] * pdVar4[lVar9];
    }
    dVar10 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
    if ((dVar11 < dVar10) &&
       (dVar10 = ABS(dVar11 - dVar10), this->tol <= dVar10 && dVar10 != this->tol)) {
      if (this->print == 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Row ");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,(this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::operator<<(poVar6," infeasible: Row value=");
        poVar6 = std::ostream::_M_insert<double>(dVar11);
        std::operator<<(poVar6,"  L=");
        poVar6 = std::ostream::_M_insert<double>
                           ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::operator<<(poVar6,"  U=");
        poVar6 = std::ostream::_M_insert<double>
                           ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar5 = this->i;
        lVar8 = (long)iVar5;
      }
      bVar7 = false;
    }
    dVar10 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
    if ((dVar10 < dVar11) &&
       (dVar10 = ABS(dVar11 - dVar10), this->tol <= dVar10 && dVar10 != this->tol)) {
      if (this->print == 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Row ");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,(this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::operator<<(poVar6," infeasible: Row value=");
        poVar6 = std::ostream::_M_insert<double>(dVar11);
        std::operator<<(poVar6,"  L=");
        poVar6 = std::ostream::_M_insert<double>
                           ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::operator<<(poVar6,"  U=");
        poVar6 = std::ostream::_M_insert<double>
                           ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar5 = this->i;
      }
      bVar7 = false;
    }
  }
  if (bVar7) {
    if (this->print == 1) {
      std::operator<<((ostream *)&std::cout,"Primal feasible.\n");
      return;
    }
  }
  else {
    if (this->print == 1) {
      std::operator<<((ostream *)&std::cout,"KKT check error: Primal infeasible.\n");
    }
    this->istrueGlb = true;
  }
  return;
}

Assistant:

void KktCheck::chPrimalFeas() {
	bool istrue = true;
	double rowV;
	//Ax = b
	for (i=0; i<numRow;i++) {
		rowV = 0;
		for (k=ARstart[i]; k<ARstart[i+1]; k++) 
			rowV = rowV + colValue[ARindex[k]]*ARvalue[k];

		if ( ((rowV-rowLower[i]) < 0) && (abs(rowV-rowLower[i]) > tol)) {
			if (print == 1) 
				cout<<"Row "<<rIndexRev[i]<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
				//cout<<"Row "<<i<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
			istrue = false;
		}

		if ( ((rowV-rowUpper[i]) > 0) && (abs(rowV-rowUpper[i]) > tol)) {
					if (print == 1)
						cout<<"Row "<<rIndexRev[i]<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
						//cout<<"Row "<<i<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
					istrue = false;
				}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Primal feasible.\n";
	}
	else {
		if (print == 1) 
			cout<<"KKT check error: Primal infeasible.\n";
		istrueGlb = true;
	}

}